

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SchemaOverlay.cpp
# Opt level: O2

void cursespp::SchemaOverlay::ShowStringOverlay
               (StringEntry *entry,PrefsPtr *prefs,
               function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
               *callback)

{
  Type TVar1;
  double value;
  char cVar2;
  int iVar3;
  InputOverlay *pIVar4;
  __0 *this;
  OverlayStack *this_00;
  runtime_error *this_01;
  DoubleEntry *doubleEntry;
  char *__s;
  bool allowEmptyValue;
  allocator<char> local_16a;
  allocator<char> local_169;
  __shared_ptr<f8n::prefs::Preferences,_(__gnu_cxx::_Lock_policy)2> local_168;
  shared_ptr<cursespp::InputOverlay> dialog;
  allocator<char> local_148 [32];
  string local_128;
  string local_108 [32];
  _Any_data local_e8;
  code *local_d8;
  code *pcStack_d0;
  __shared_ptr<cursespp::ILayout,(__gnu_cxx::_Lock_policy)2> local_c0 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_b8;
  __shared_ptr<f8n::prefs::Preferences,_(__gnu_cxx::_Lock_policy)2> local_b0;
  string name;
  anon_class_80_3_1ce9ae6c handler;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&name,(entry->entry).name,(allocator<char> *)&handler);
  std::__shared_ptr<f8n::prefs::Preferences,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<f8n::prefs::Preferences,_(__gnu_cxx::_Lock_policy)2> *)&handler,
             &prefs->super___shared_ptr<f8n::prefs::Preferences,_(__gnu_cxx::_Lock_policy)2>);
  std::__cxx11::string::string((string *)&handler.name,(string *)&name);
  std::
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>::
  function(&handler.callback,callback);
  pIVar4 = (InputOverlay *)operator_new(0x308);
  InputOverlay::InputOverlay(pIVar4);
  std::__shared_ptr<cursespp::InputOverlay,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<cursespp::InputOverlay,void>
            ((__shared_ptr<cursespp::InputOverlay,(__gnu_cxx::_Lock_policy)2> *)&dialog,pIVar4);
  pIVar4 = InputOverlay::SetTitle
                     (dialog.super___shared_ptr<cursespp::InputOverlay,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr,&name);
  std::__shared_ptr<f8n::prefs::Preferences,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_b0,
             &prefs->super___shared_ptr<f8n::prefs::Preferences,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<f8n::prefs::Preferences,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_168,&local_b0);
  TVar1 = (entry->entry).type;
  std::__cxx11::string::string<std::allocator<char>>(local_108,(entry->entry).name,&local_169);
  switch(TVar1) {
  case Bool:
    cVar2 = (**(code **)(*(long *)local_168._M_ptr + 0x50))
                      (local_168._M_ptr,local_108,*(undefined1 *)&entry->defaultValue);
    __s = "false";
    if (cVar2 != '\0') {
      __s = "true";
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_128,__s,local_148);
    break;
  case Int:
    iVar3 = (**(code **)(*(long *)local_168._M_ptr + 0x58))
                      (local_168._M_ptr,local_108,entry[1].entry.type);
    std::__cxx11::to_string(&local_128,iVar3);
    break;
  case Double:
    iVar3 = *(int *)&entry[1].entry.name;
    value = (double)(**(code **)(*(long *)local_168._M_ptr + 0x60))
                              ((int)entry[1].defaultValue,local_168._M_ptr,local_108);
    stringValueForDouble_abi_cxx11_(&local_128,value,iVar3);
    break;
  case String:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_148,entry->defaultValue,&local_16a);
    (**(code **)(*(long *)local_168._M_ptr + 0x68))(&local_128,local_168._M_ptr,local_108,local_148)
    ;
    goto LAB_0018d4ae;
  case Enum:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_148,entry[1].entry.name,&local_16a);
    (**(code **)(*(long *)local_168._M_ptr + 0x68))(&local_128,local_168._M_ptr,local_108,local_148)
    ;
LAB_0018d4ae:
    std::__cxx11::string::~string((string *)local_148);
    break;
  default:
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_01,"invalid type passed to stringValueFor!");
    __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::~string(local_108);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_168._M_refcount);
  pIVar4 = InputOverlay::SetText(pIVar4,&local_128);
  iVar3 = overlayWidth();
  pIVar4 = InputOverlay::SetWidth(pIVar4,iVar3);
  if (entry->defaultValue == (char *)0x0) {
    allowEmptyValue = false;
  }
  else {
    allowEmptyValue = *entry->defaultValue != '\0';
  }
  pIVar4 = InputOverlay::SetAllowEmptyValue(pIVar4,allowEmptyValue);
  local_d8 = (code *)0x0;
  pcStack_d0 = (code *)0x0;
  local_e8._M_unused._M_object = (void *)0x0;
  local_e8._8_8_ = 0;
  this = (__0 *)operator_new(0x50);
  ShowStringOverlay(f8n::sdk::ISchema::StringEntry_const*,std::shared_ptr<f8n::prefs::Preferences>,std::function<void(std::__cxx11::string)>)
  ::$_0::__0(this,&handler);
  pcStack_d0 = std::
               _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/clangen[P]cursespp/src/SchemaOverlay.cpp:358:20)>
               ::_M_invoke;
  local_d8 = std::
             _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/clangen[P]cursespp/src/SchemaOverlay.cpp:358:20)>
             ::_M_manager;
  local_e8._M_unused._0_8_ = (undefined8)this;
  InputOverlay::SetInputAcceptedCallback(pIVar4,(InputAcceptedCallback *)&local_e8);
  std::_Function_base::~_Function_base((_Function_base *)&local_e8);
  std::__cxx11::string::~string((string *)&local_128);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b0._M_refcount);
  this_00 = App::Overlays();
  std::__shared_ptr<cursespp::ILayout,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<cursespp::InputOverlay,void>
            (local_c0,&dialog.super___shared_ptr<cursespp::InputOverlay,_(__gnu_cxx::_Lock_policy)2>
            );
  OverlayStack::Push(this_00,(ILayoutPtr *)local_c0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&dialog.super___shared_ptr<cursespp::InputOverlay,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  ShowStringOverlay(f8n::sdk::ISchema::StringEntry_const*,std::shared_ptr<f8n::prefs::Preferences>,std::function<void(std::__cxx11::string)>)
  ::$_0::~__0((__0 *)&handler);
  std::__cxx11::string::~string((string *)&name);
  return;
}

Assistant:

void SchemaOverlay::ShowStringOverlay(
    const ISchema::StringEntry* entry,
    PrefsPtr prefs,
    std::function<void(std::string)> callback)
{
    std::string name(entry->entry.name);

    auto handler = [prefs, name, callback](std::string value) {
        prefs->SetString(name, value.c_str());
        if (callback) { callback(value); }
    };

    std::shared_ptr<InputOverlay> dialog(new InputOverlay());

    dialog->SetTitle(name)
        .SetText(stringValueFor(prefs, entry))
        .SetWidth(overlayWidth())
        .SetAllowEmptyValue(entry->defaultValue && strlen(entry->defaultValue))
        .SetInputAcceptedCallback(handler);

    App::Overlays().Push(dialog);
}